

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O0

SMBusByte * __thiscall SMBusByte::ToDataByte(SMBusByte *this,SMBusFrameType frame_type)

{
  byte *pbVar1;
  undefined1 uVar2;
  undefined6 uVar3;
  const_reference pvVar4;
  U8 in_DL;
  undefined4 in_register_00000034;
  SMBusFrameType frame_type_local;
  SMBusByte *this_local;
  Frame *f;
  
  pbVar1 = (byte *)CONCAT44(in_register_00000034,frame_type);
  Frame::Frame((Frame *)this);
  this[1].value = in_DL;
  pvVar4 = std::vector<SMBusSignalState,_std::allocator<SMBusSignalState>_>::front
                     ((vector<SMBusSignalState,_std::allocator<SMBusSignalState>_> *)(pbVar1 + 8));
  uVar2 = *(undefined1 *)((long)&pvVar4->sample_begin + 1);
  uVar3 = *(undefined6 *)((long)&pvVar4->sample_begin + 2);
  this->value = *(undefined1 *)&pvVar4->sample_begin;
  this->is_acked = (bool)uVar2;
  *(undefined6 *)&this->field_0x2 = uVar3;
  pvVar4 = std::vector<SMBusSignalState,_std::allocator<SMBusSignalState>_>::back
                     ((vector<SMBusSignalState,_std::allocator<SMBusSignalState>_> *)(pbVar1 + 8));
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pvVar4->sample_end;
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(ulong)*pbVar1;
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this[1].is_acked = false;
  if ((pbVar1[1] & 1) != 0) {
    this[1].is_acked = (bool)(this[1].is_acked | 1);
  }
  return this;
}

Assistant:

Frame SMBusByte::ToDataByte( SMBusFrameType frame_type ) const
{
    Frame f;

    f.mType = frame_type;
    f.mStartingSampleInclusive = signals.front().sample_begin;
    f.mEndingSampleInclusive = signals.back().sample_end;
    f.mData1 = value;
    f.mData2 = 0;
    f.mFlags = 0;
    if( is_acked )
        f.mFlags |= F_IsAcked;

    return f;
}